

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O3

void grayscale_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                      JSAMPARRAY output_buf,int num_rows)

{
  jcopy_sample_rows(*input_buf,input_row,output_buf,0,num_rows,cinfo->output_width);
  return;
}

Assistant:

METHODDEF(void)
grayscale_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                  JSAMPIMAGE output_buf, JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;
  int instride = cinfo->input_components;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr = output_buf[0][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      outptr[col] = inptr[0];
      inptr += instride;
    }
  }
}